

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  uint start_00;
  int local_68;
  int end;
  int start;
  int rlepos_1;
  bitset_container_t *answer;
  int run_value;
  int run_end;
  int run_start;
  int rlepos;
  array_container_t *answer_1;
  int32_t min_size_non_run;
  int32_t size_as_array_container;
  int32_t card;
  int32_t size_as_bitset_container;
  int32_t size_as_run_container;
  uint8_t *typecode_after_local;
  run_container_t *c_local;
  
  iVar2 = run_container_serialized_size_in_bytes(c->n_runs);
  iVar3 = bitset_container_serialized_size_in_bytes();
  iVar4 = run_container_cardinality(c);
  local_68 = array_container_serialized_size_in_bytes(iVar4);
  if (iVar3 < local_68) {
    local_68 = iVar3;
  }
  if (local_68 < iVar2) {
    if (iVar4 < 0x1001) {
      c_local = (run_container_t *)array_container_create_given_capacity(iVar4);
      ((array_container_t *)c_local)->cardinality = 0;
      for (run_end = 0; run_end < c->n_runs; run_end = run_end + 1) {
        answer._0_4_ = (uint)c->runs[run_end].value;
        iVar4 = (uint)answer + c->runs[run_end].length;
        for (; (int)(uint)answer <= iVar4; answer._0_4_ = (uint)answer + 1) {
          iVar1 = ((array_container_t *)c_local)->cardinality;
          ((array_container_t *)c_local)->cardinality = iVar1 + 1;
          ((array_container_t *)c_local)->array[iVar1] = (uint16_t)(uint)answer;
        }
      }
      *typecode_after = '\x02';
    }
    else {
      c_local = (run_container_t *)bitset_container_create();
      for (end = 0; end < c->n_runs; end = end + 1) {
        start_00 = (uint)c->runs[end].value;
        bitset_set_range((uint64_t *)c_local->runs,start_00,start_00 + c->runs[end].length + 1);
      }
      c_local->n_runs = iVar4;
      *typecode_after = '\x01';
    }
  }
  else {
    *typecode_after = '\x03';
    c_local = c;
  }
  return c_local;
}

Assistant:

container_t *convert_run_to_efficient_container(
    run_container_t *c,
    uint8_t *typecode_after
){
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}